

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Instruction::IsVulkanStorageBufferVariable(Instruction *this)

{
  IRContext *this_00;
  DefUseManager *this_01;
  bool bVar1;
  uint32_t uVar2;
  Instruction *this_02;
  
  if (this->opcode_ == OpVariable) {
    uVar2 = (this->has_result_id_ & 1) + 1;
    if (this->has_type_id_ == false) {
      uVar2 = (uint)this->has_result_id_;
    }
    uVar2 = GetSingleWordOperand(this,uVar2);
    if ((uVar2 == 0xc) || (uVar2 == 2)) {
      this_00 = this->context_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      this_01 = (this_00->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
      ;
      uVar2 = 0;
      if (this->has_type_id_ == true) {
        uVar2 = GetSingleWordOperand(this,0);
      }
      this_02 = analysis::DefUseManager::GetDef(this_01,uVar2);
      if (this_02 != (Instruction *)0x0) {
        bVar1 = IsVulkanStorageBuffer(this_02);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool Instruction::IsVulkanStorageBufferVariable() const {
  if (opcode() != spv::Op::OpVariable) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kVariableStorageClassIndex));
  if (storage_class == spv::StorageClass::StorageBuffer ||
      storage_class == spv::StorageClass::Uniform) {
    Instruction* var_type = context()->get_def_use_mgr()->GetDef(type_id());
    return var_type != nullptr && var_type->IsVulkanStorageBuffer();
  }

  return false;
}